

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivKernel2D.cpp
# Opt level: O3

void TPZShapeHDivKernel2D<pzshape::TPZShapeLinear>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *divphi)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  TPZShapeH1<pzshape::TPZShapeLinear>::Shape(pt,data);
  (*(divphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (divphi);
  uVar3 = (uint)(data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                fRow;
  (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (phi,2,(long)(int)uVar3);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      lVar1 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
              fRow;
      if ((lVar1 < 1) ||
         ((data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <=
          (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar2 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar2 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar4)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      phi->fElem[lVar2 * uVar4] = (data->fDPhi).super_TPZFMatrix<double>.fElem[lVar1 * uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  return;
}

Assistant:

void TPZShapeHDivKernel2D<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &divphi)
{

    const int dim = TSHAPE::Dimension;
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    divphi.Zero();

    int nshape = data.fPhi.Rows();
    phi.Resize(2,nshape);

    switch (dim)
    {
    case 1:
        for (int i = 0; i < nshape; i++){
            phi(0,i) = data.fDPhi(0,i);
        }
        break;
    
    case 2:
        for (int i = 0; i < nshape; i++){
            phi(0,i) =  data.fDPhi(1,i);
            phi(1,i) = -data.fDPhi(0,i);
        }
        break;
    
    default:
        DebugStop();
        break;
    }


}